

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int simpleOpen(sqlite3_tokenizer *pTokenizer,char *pInput,int nBytes,
              sqlite3_tokenizer_cursor **ppCursor)

{
  sqlite3_tokenizer_cursor *psVar1;
  size_t sVar2;
  simple_tokenizer_cursor *c;
  sqlite3_tokenizer_cursor **ppCursor_local;
  int nBytes_local;
  char *pInput_local;
  sqlite3_tokenizer *pTokenizer_local;
  
  psVar1 = (sqlite3_tokenizer_cursor *)sqlite3_malloc(0x30);
  if (psVar1 == (sqlite3_tokenizer_cursor *)0x0) {
    pTokenizer_local._4_4_ = 7;
  }
  else {
    psVar1[1].pTokenizer = (sqlite3_tokenizer *)pInput;
    if (pInput == (char *)0x0) {
      *(undefined4 *)&psVar1[2].pTokenizer = 0;
    }
    else if (nBytes < 0) {
      sVar2 = strlen(pInput);
      *(int *)&psVar1[2].pTokenizer = (int)sVar2;
    }
    else {
      *(int *)&psVar1[2].pTokenizer = nBytes;
    }
    *(undefined4 *)((long)&psVar1[2].pTokenizer + 4) = 0;
    *(undefined4 *)&psVar1[3].pTokenizer = 0;
    psVar1[4].pTokenizer = (sqlite3_tokenizer *)0x0;
    *(undefined4 *)&psVar1[5].pTokenizer = 0;
    *ppCursor = psVar1;
    pTokenizer_local._4_4_ = 0;
  }
  return pTokenizer_local._4_4_;
}

Assistant:

static int simpleOpen(
  sqlite3_tokenizer *pTokenizer,         /* The tokenizer */
  const char *pInput, int nBytes,        /* String to be tokenized */
  sqlite3_tokenizer_cursor **ppCursor    /* OUT: Tokenization cursor */
){
  simple_tokenizer_cursor *c;

  UNUSED_PARAMETER(pTokenizer);

  c = (simple_tokenizer_cursor *) sqlite3_malloc(sizeof(*c));
  if( c==NULL ) return SQLITE_NOMEM;

  c->pInput = pInput;
  if( pInput==0 ){
    c->nBytes = 0;
  }else if( nBytes<0 ){
    c->nBytes = (int)strlen(pInput);
  }else{
    c->nBytes = nBytes;
  }
  c->iOffset = 0;                 /* start tokenizing at the beginning */
  c->iToken = 0;
  c->pToken = NULL;               /* no space allocated, yet. */
  c->nTokenAllocated = 0;

  *ppCursor = &c->base;
  return SQLITE_OK;
}